

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O1

void print(int **arr,string *s,int width)

{
  long lVar1;
  bool bVar2;
  code cVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(s->_M_dataplus)._M_p,s->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (0 < bsize) {
    lVar6 = 1;
    do {
      if (0 < bsize) {
        lVar5 = 0;
        do {
          lVar1 = *(long *)(std::cout + -0x18);
          if ((&DAT_002ca289)[lVar1] == '\0') {
            cVar3 = (code)std::ios::widen((char)lVar1 + -0x58);
            _ITM_registerTMCloneTable[lVar1] = cVar3;
            (&DAT_002ca289)[lVar1] = 1;
          }
          _ITM_registerTMCloneTable[lVar1] = (code)0x20;
          *(long *)(std::operator>> + *(long *)(std::cout + -0x18)) = (long)width;
          std::ostream::operator<<((ostream *)&std::cout,arr[lVar6][lVar5 + 1]);
          lVar5 = lVar5 + 1;
        } while (lVar5 < bsize);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      bVar2 = lVar6 < bsize;
      lVar6 = lVar6 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void print(int **arr, const string &s, int width = 1) {
    cout << s << endl;
    for (int i = 1; i <= bsize; i++) {
        for (int j = 1; j <= bsize; j++) {
            cout << setfill(' ') << setw(width) << arr[i][j];
        }
        cout << endl;
    }
}